

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

Bus_Man_t * Bus_ManStart(Abc_Ntk_t *pNtk,SC_Lib *pLib,SC_BusPars *pPars)

{
  int iVar1;
  Bus_Man_t *pBVar2;
  SC_Cell *pSVar3;
  SC_WireLoad *pSVar4;
  char *pcVar5;
  Vec_Flt_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  float Area;
  Bus_Man_t *p;
  SC_BusPars *pPars_local;
  SC_Lib *pLib_local;
  Abc_Ntk_t *pNtk_local;
  
  pBVar2 = (Bus_Man_t *)calloc(1,0x60);
  pBVar2->pPars = pPars;
  pBVar2->pNtk = pNtk;
  pBVar2->pLib = pLib;
  pSVar3 = Abc_SclFindInvertor(pLib,pPars->fAddBufs);
  pBVar2->pInv = pSVar3->pRepr->pPrev;
  if (pPars->fUseWireLoads != 0) {
    if (pNtk->pWLoadUsed == (char *)0x0) {
      Area = Abc_SclGetTotalArea(pNtk);
      pSVar4 = Abc_SclFindWireLoadModel(pLib,Area);
      pBVar2->pWLoadUsed = pSVar4;
      if (pBVar2->pWLoadUsed != (SC_WireLoad *)0x0) {
        pcVar5 = Abc_UtilStrsav(pBVar2->pWLoadUsed->pName);
        pNtk->pWLoadUsed = pcVar5;
      }
    }
    else {
      pSVar4 = Abc_SclFetchWireLoadModel(pLib,pNtk->pWLoadUsed);
      pBVar2->pWLoadUsed = pSVar4;
    }
  }
  if (pBVar2->pWLoadUsed != (SC_WireLoad *)0x0) {
    pSVar4 = pBVar2->pWLoadUsed;
    iVar1 = Abc_NtkGetFanoutMax(pNtk);
    pVVar6 = Abc_SclFindWireCaps(pSVar4,iVar1);
    pBVar2->vWireCaps = pVVar6;
  }
  pVVar7 = Vec_PtrAlloc(100);
  pBVar2->vFanouts = pVVar7;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  pVVar6 = Vec_FltAlloc(iVar1 * 2 + 1000);
  pBVar2->vCins = pVVar6;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  pVVar6 = Vec_FltAlloc(iVar1 * 2 + 1000);
  pBVar2->vETimes = pVVar6;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  pVVar6 = Vec_FltAlloc(iVar1 * 2 + 1000);
  pBVar2->vLoads = pVVar6;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  pVVar6 = Vec_FltAlloc(iVar1 * 2 + 1000);
  pBVar2->vDepts = pVVar6;
  pVVar6 = pBVar2->vCins;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_FltFill(pVVar6,iVar1,0.0);
  pVVar6 = pBVar2->vETimes;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_FltFill(pVVar6,iVar1,0.0);
  pVVar6 = pBVar2->vLoads;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_FltFill(pVVar6,iVar1,0.0);
  pVVar6 = pBVar2->vDepts;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_FltFill(pVVar6,iVar1,0.0);
  pNtk->pBSMan = pBVar2;
  return pBVar2;
}

Assistant:

Bus_Man_t * Bus_ManStart( Abc_Ntk_t * pNtk, SC_Lib * pLib, SC_BusPars * pPars )
{
    Bus_Man_t * p;
    p = ABC_CALLOC( Bus_Man_t, 1 );
    p->pPars     = pPars;
    p->pNtk      = pNtk;
    p->pLib      = pLib;
    p->pInv      = Abc_SclFindInvertor(pLib, pPars->fAddBufs)->pRepr->pPrev;//->pAve;
    if ( pPars->fUseWireLoads )
    { 
        if ( pNtk->pWLoadUsed == NULL )
        {            
            p->pWLoadUsed = Abc_SclFindWireLoadModel( pLib, Abc_SclGetTotalArea(pNtk) );
            if ( p->pWLoadUsed )
            pNtk->pWLoadUsed = Abc_UtilStrsav( p->pWLoadUsed->pName );
        }
        else
            p->pWLoadUsed = Abc_SclFetchWireLoadModel( pLib, pNtk->pWLoadUsed );
    }
    if ( p->pWLoadUsed )
    p->vWireCaps = Abc_SclFindWireCaps( p->pWLoadUsed, Abc_NtkGetFanoutMax(pNtk) );
    p->vFanouts  = Vec_PtrAlloc( 100 );
    p->vCins     = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    p->vETimes   = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    p->vLoads    = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    p->vDepts    = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    Vec_FltFill( p->vCins,   Abc_NtkObjNumMax(pNtk), 0 );
    Vec_FltFill( p->vETimes, Abc_NtkObjNumMax(pNtk), 0 );
    Vec_FltFill( p->vLoads,  Abc_NtkObjNumMax(pNtk), 0 );
    Vec_FltFill( p->vDepts,  Abc_NtkObjNumMax(pNtk), 0 );
    pNtk->pBSMan = p;
    return p;
}